

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compute_variance.cpp
# Opt level: O0

void brent_kung_prefix_sum(vfloat4 *d,size_t items,int stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  ulong uVar4;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  size_t ofs_stride;
  ptrdiff_t ofs;
  vfloat4 *da;
  size_t iters;
  size_t start;
  size_t step;
  size_t log2_stride;
  size_t lc_stride;
  undefined8 *local_198;
  ulong local_190;
  undefined8 *local_130;
  ulong local_128;
  ulong local_108;
  size_t ofs_stride_1;
  ptrdiff_t ofs_1;
  vfloat4 *da_1;
  size_t iters_1;
  size_t start_1;
  size_t step_1;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  if (1 < in_RSI) {
    local_108 = 2;
    bVar3 = 1;
    do {
      local_130 = (undefined8 *)(in_RDI + (local_108 - 1) * (long)in_EDX * 0x10);
      for (local_128 = in_RSI >> (bVar3 & 0x3f); local_128 != 0; local_128 = local_128 - 1) {
        uVar1 = local_130[(local_108 >> 1) * (long)in_EDX * -2];
        uVar2 = (local_130 + (local_108 >> 1) * (long)in_EDX * -2)[1];
        iters_1._0_4_ = (float)*local_130;
        iters_1._4_4_ = (float)((ulong)*local_130 >> 0x20);
        start_1._0_4_ = (float)local_130[1];
        start_1._4_4_ = (float)((ulong)local_130[1] >> 0x20);
        ofs_1._0_4_ = (float)uVar1;
        ofs_1._4_4_ = (float)((ulong)uVar1 >> 0x20);
        da_1._0_4_ = (float)uVar2;
        da_1._4_4_ = (float)((ulong)uVar2 >> 0x20);
        *local_130 = CONCAT44(iters_1._4_4_ + ofs_1._4_4_,(float)iters_1 + (float)ofs_1);
        local_130[1] = CONCAT44(start_1._4_4_ + da_1._4_4_,(float)start_1 + da_1._0_4_);
        local_130 = local_130 + (long)(in_EDX << (bVar3 & 0x1f)) * 2;
      }
      bVar3 = bVar3 + 1;
      local_108 = local_108 << 1;
    } while (local_108 <= in_RSI);
    do {
      bVar3 = bVar3 - 1;
      uVar4 = local_108 >> 1;
      local_108 = local_108 >> 2;
      local_198 = (undefined8 *)(in_RDI + (local_108 + uVar4 + -1) * (long)in_EDX * 0x10);
      for (local_190 = in_RSI - local_108 >> (bVar3 & 0x3f); local_190 != 0;
          local_190 = local_190 - 1) {
        uVar1 = local_198[local_108 * (long)in_EDX * -2];
        uVar2 = (local_198 + local_108 * (long)in_EDX * -2)[1];
        local_18 = (float)*local_198;
        fStack_14 = (float)((ulong)*local_198 >> 0x20);
        fStack_10 = (float)local_198[1];
        fStack_c = (float)((ulong)local_198[1] >> 0x20);
        step_1._0_4_ = (float)uVar1;
        step_1._4_4_ = (float)((ulong)uVar1 >> 0x20);
        fStack_20 = (float)uVar2;
        fStack_1c = (float)((ulong)uVar2 >> 0x20);
        *local_198 = CONCAT44(fStack_14 + step_1._4_4_,local_18 + (float)step_1);
        local_198[1] = CONCAT44(fStack_c + fStack_1c,fStack_10 + fStack_20);
        local_198 = local_198 + (long)(in_EDX << (bVar3 & 0x1f)) * 2;
      }
      local_108 = uVar4;
    } while (2 < uVar4);
  }
  return;
}

Assistant:

static void brent_kung_prefix_sum(
	vfloat4* d,
	size_t items,
	int stride
) {
	if (items < 2)
		return;

	size_t lc_stride = 2;
	size_t log2_stride = 1;

	// The reduction-tree loop
	do {
		size_t step = lc_stride >> 1;
		size_t start = lc_stride - 1;
		size_t iters = items >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}

		log2_stride += 1;
		lc_stride <<= 1;
	} while (lc_stride <= items);

	// The expansion-tree loop
	do {
		log2_stride -= 1;
		lc_stride >>= 1;

		size_t step = lc_stride >> 1;
		size_t start = step + lc_stride - 1;
		size_t iters = (items - step) >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}
	} while (lc_stride > 2);
}